

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

int cmSystemTools::WaitForLine
              (cmsysProcess *process,string *line,cmDuration timeout,
              vector<char,_std::allocator<char>_> *out,vector<char,_std::allocator<char>_> *err)

{
  bool bVar1;
  reference pcVar2;
  ulong uVar3;
  reference pvVar4;
  bool local_319;
  bool local_2f9;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_2f0;
  const_iterator local_2e8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_2e0;
  const_iterator local_2d8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_2d0;
  char *local_2c8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_2c0;
  const_iterator local_2b8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_2b0;
  const_iterator local_2a8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_2a0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_270;
  const_iterator local_268;
  size_type local_260;
  size_type size_3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_210;
  const_iterator local_208;
  size_type local_200;
  size_type size_2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1b0;
  const_iterator local_1a8;
  size_type local_1a0;
  size_type size_1;
  char *local_190;
  char *local_188;
  char *local_180;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_170;
  const_iterator local_168;
  size_type local_160;
  size_type size;
  rep rStack_150;
  int pipe;
  double timeoutAsDbl;
  char *data;
  iterator iStack_138;
  int length;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_130;
  const_iterator local_128;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_120;
  const_iterator local_118;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_110;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_108;
  ulong local_100;
  size_type length_2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_f0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_e8;
  undefined4 local_dc;
  char *local_d8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_d0;
  const_iterator local_c8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_c0;
  const_iterator local_b8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_a0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_98;
  ulong local_90;
  size_type length_1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_80;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_78;
  undefined1 local_70 [8];
  string strdata;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Stack_48;
  cmProcessOutput processOutput;
  iterator erriter;
  iterator outiter;
  vector<char,_std::allocator<char>_> *err_local;
  vector<char,_std::allocator<char>_> *out_local;
  string *line_local;
  cmsysProcess *process_local;
  cmDuration timeout_local;
  
  process_local = (cmsysProcess *)timeout.__r;
  std::__cxx11::string::clear();
  erriter = std::vector<char,_std::allocator<char>_>::begin(out);
  _Stack_48._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
  cmProcessOutput::cmProcessOutput
            ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),Auto,0x400);
  std::__cxx11::string::string((string *)local_70);
LAB_002c8583:
  do {
    local_78._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(out);
    bVar1 = __gnu_cxx::operator!=(&erriter,&local_78);
    if (bVar1) {
      pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&erriter);
      local_2f9 = false;
      if (*pcVar2 == '\r') {
        local_80 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator+(&erriter,1);
        length_1 = (size_type)std::vector<char,_std::allocator<char>_>::end(out);
        local_2f9 = __gnu_cxx::operator==
                              (&local_80,
                               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                *)&length_1);
      }
      if (local_2f9 == false) {
        pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&erriter);
        if ((*pcVar2 == '\n') ||
           (pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                     ::operator*(&erriter), *pcVar2 == '\0')) {
          local_98._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
          local_90 = __gnu_cxx::operator-(&erriter,&local_98);
          bVar1 = false;
          if (1 < local_90) {
            local_a0 = __gnu_cxx::
                       __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                       operator-(&erriter,1);
            pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                     ::operator*(&local_a0);
            bVar1 = *pcVar2 == '\r';
          }
          if (bVar1) {
            local_90 = local_90 - 1;
          }
          if (local_90 != 0) {
            pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](out,0);
            std::__cxx11::string::append((char *)line,(ulong)pvVar4);
          }
          local_c0._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
          __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
          __normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                     &local_b8,&local_c0);
          local_d0 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                     ::operator+(&erriter,1);
          __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
          __normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                     &local_c8,&local_d0);
          local_d8 = (char *)std::vector<char,_std::allocator<char>_>::erase(out,local_b8,local_c8);
          timeout_local.__r._4_4_ = 2;
          goto LAB_002c90f5;
        }
        __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                  (&erriter);
        goto LAB_002c8583;
      }
    }
    while( true ) {
      local_e8._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(err);
      bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffffb8,&local_e8);
      if (!bVar1) break;
      pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&stack0xffffffffffffffb8);
      local_319 = false;
      if (*pcVar2 == '\r') {
        local_f0 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator+(&stack0xffffffffffffffb8,1);
        length_2 = (size_type)std::vector<char,_std::allocator<char>_>::end(err);
        local_319 = __gnu_cxx::operator==
                              (&local_f0,
                               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                *)&length_2);
      }
      if (local_319 != false) break;
      pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&stack0xffffffffffffffb8);
      if ((*pcVar2 == '\n') ||
         (pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator*(&stack0xffffffffffffffb8), *pcVar2 == '\0')) {
        local_108._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
        local_100 = __gnu_cxx::operator-(&stack0xffffffffffffffb8,&local_108);
        bVar1 = false;
        if (1 < local_100) {
          local_110 = __gnu_cxx::
                      __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                      operator-(&stack0xffffffffffffffb8,1);
          pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator*(&local_110);
          bVar1 = *pcVar2 == '\r';
        }
        if (bVar1) {
          local_100 = local_100 - 1;
        }
        if (local_100 != 0) {
          pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](err,0);
          std::__cxx11::string::append((char *)line,(ulong)pvVar4);
        }
        local_120._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_118,&local_120);
        local_130 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                    ::operator+(&stack0xffffffffffffffb8,1);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_128,&local_130);
        iStack_138 = std::vector<char,_std::allocator<char>_>::erase(err,local_118,local_128);
        timeout_local.__r._4_4_ = 3;
        goto LAB_002c90f5;
      }
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                (&stack0xffffffffffffffb8);
    }
    rStack_150 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                           ((duration<double,_std::ratio<1L,_1L>_> *)&process_local);
    size._4_4_ = cmsysProcess_WaitForData
                           (process,(char **)&timeoutAsDbl,(int *)((long)&data + 4),
                            &stack0xfffffffffffffeb0);
    if (size._4_4_ == 0xff) {
      timeout_local.__r._4_4_ = 0xff;
      goto LAB_002c90f5;
    }
    if (size._4_4_ == 2) {
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),(char *)timeoutAsDbl,
                 (long)data._4_4_,(string *)local_70,1);
      local_160 = std::vector<char,_std::allocator<char>_>::size(out);
      local_170._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(out);
      __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
      __normal_iterator<char*>
                ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_168
                 ,&local_170);
      local_178._M_current = (char *)std::__cxx11::string::begin();
      local_180 = (char *)std::__cxx11::string::end();
      local_188 = (char *)std::vector<char,std::allocator<char>>::
                          insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                                    ((vector<char,std::allocator<char>> *)out,local_168,local_178,
                                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )local_180);
      size_1 = (size_type)std::vector<char,_std::allocator<char>_>::begin(out);
      local_190 = (char *)__gnu_cxx::
                          __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                          operator+((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                     *)&size_1,local_160);
      erriter._M_current = local_190;
    }
    else if (size._4_4_ == 3) {
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),(char *)timeoutAsDbl,
                 (long)data._4_4_,(string *)local_70,2);
      local_1a0 = std::vector<char,_std::allocator<char>_>::size(err);
      local_1b0._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(err);
      __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
      __normal_iterator<char*>
                ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_1a8
                 ,&local_1b0);
      local_1b8._M_current = (char *)std::__cxx11::string::begin();
      local_1c0 = (char *)std::__cxx11::string::end();
      local_1c8 = (char *)std::vector<char,std::allocator<char>>::
                          insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                                    ((vector<char,std::allocator<char>> *)err,local_1a8,local_1b8,
                                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )local_1c0);
      local_1d8._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
      local_1d0 = (char *)__gnu_cxx::
                          __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                          operator+(&local_1d8,local_1a0);
      _Stack_48 = (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_1d0;
    }
    else if (size._4_4_ == 0) {
      std::__cxx11::string::string((string *)&size_2);
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),(string *)&size_2,
                 (string *)local_70,1);
      std::__cxx11::string::~string((string *)&size_2);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        local_200 = std::vector<char,_std::allocator<char>_>::size(out);
        local_210._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(out);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_208,&local_210);
        local_218._M_current = (char *)std::__cxx11::string::begin();
        local_220 = (char *)std::__cxx11::string::end();
        local_228 = (char *)std::vector<char,std::allocator<char>>::
                            insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                                      ((vector<char,std::allocator<char>> *)out,local_208,local_218,
                                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )local_220);
        local_238._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
        local_230 = (char *)__gnu_cxx::
                            __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                            operator+(&local_238,local_200);
        erriter._M_current = local_230;
      }
      std::__cxx11::string::string((string *)&size_3);
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),(string *)&size_3,
                 (string *)local_70,2);
      std::__cxx11::string::~string((string *)&size_3);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        local_260 = std::vector<char,_std::allocator<char>_>::size(err);
        local_270._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(err);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_268,&local_270);
        local_278._M_current = (char *)std::__cxx11::string::begin();
        local_280 = (char *)std::__cxx11::string::end();
        local_288 = (char *)std::vector<char,std::allocator<char>>::
                            insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                                      ((vector<char,std::allocator<char>> *)err,local_268,local_278,
                                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )local_280);
        local_298._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
        local_290 = (char *)__gnu_cxx::
                            __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                            operator+(&local_298,local_260);
        _Stack_48 = (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_290;
      }
      bVar1 = std::vector<char,_std::allocator<char>_>::empty(out);
      if (bVar1) {
        bVar1 = std::vector<char,_std::allocator<char>_>::empty(err);
        if (bVar1) {
          timeout_local.__r._4_4_ = 0;
        }
        else {
          pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](err,0);
          local_2d0._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
          __gnu_cxx::operator-(&stack0xffffffffffffffb8,&local_2d0);
          std::__cxx11::string::append((char *)line,(ulong)pvVar4);
          local_2e0._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
          __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
          __normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                     &local_2d8,&local_2e0);
          local_2f0._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(err);
          __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
          __normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                     &local_2e8,&local_2f0);
          std::vector<char,_std::allocator<char>_>::erase(err,local_2d8,local_2e8);
          timeout_local.__r._4_4_ = 3;
        }
      }
      else {
        pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](out,0);
        local_2a0._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
        __gnu_cxx::operator-(&erriter,&local_2a0);
        std::__cxx11::string::append((char *)line,(ulong)pvVar4);
        local_2b0._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_2a8,&local_2b0);
        local_2c0._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(out);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_2b8,&local_2c0);
        local_2c8 = (char *)std::vector<char,_std::allocator<char>_>::erase(out,local_2a8,local_2b8)
        ;
        timeout_local.__r._4_4_ = 2;
      }
LAB_002c90f5:
      local_dc = 1;
      std::__cxx11::string::~string((string *)local_70);
      cmProcessOutput::~cmProcessOutput((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf));
      return timeout_local.__r._4_4_;
    }
  } while( true );
}

Assistant:

int cmSystemTools::WaitForLine(cmsysProcess* process, std::string& line,
                               cmDuration timeout, std::vector<char>& out,
                               std::vector<char>& err)
{
  line.clear();
  std::vector<char>::iterator outiter = out.begin();
  std::vector<char>::iterator erriter = err.begin();
  cmProcessOutput processOutput;
  std::string strdata;
  while (true) {
    // Check for a newline in stdout.
    for (; outiter != out.end(); ++outiter) {
      if ((*outiter == '\r') && ((outiter + 1) == out.end())) {
        break;
      }
      if (*outiter == '\n' || *outiter == '\0') {
        std::vector<char>::size_type length = outiter - out.begin();
        if (length > 1 && *(outiter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(&out[0], length);
        }
        out.erase(out.begin(), outiter + 1);
        return cmsysProcess_Pipe_STDOUT;
      }
    }

    // Check for a newline in stderr.
    for (; erriter != err.end(); ++erriter) {
      if ((*erriter == '\r') && ((erriter + 1) == err.end())) {
        break;
      }
      if (*erriter == '\n' || *erriter == '\0') {
        std::vector<char>::size_type length = erriter - err.begin();
        if (length > 1 && *(erriter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(&err[0], length);
        }
        err.erase(err.begin(), erriter + 1);
        return cmsysProcess_Pipe_STDERR;
      }
    }

    // No newlines found.  Wait for more data from the process.
    int length;
    char* data;
    double timeoutAsDbl = timeout.count();
    int pipe =
      cmsysProcess_WaitForData(process, &data, &length, &timeoutAsDbl);
    if (pipe == cmsysProcess_Pipe_Timeout) {
      // Timeout has been exceeded.
      return pipe;
    }
    if (pipe == cmsysProcess_Pipe_STDOUT) {
      processOutput.DecodeText(data, length, strdata, 1);
      // Append to the stdout buffer.
      std::vector<char>::size_type size = out.size();
      out.insert(out.end(), strdata.begin(), strdata.end());
      outiter = out.begin() + size;
    } else if (pipe == cmsysProcess_Pipe_STDERR) {
      processOutput.DecodeText(data, length, strdata, 2);
      // Append to the stderr buffer.
      std::vector<char>::size_type size = err.size();
      err.insert(err.end(), strdata.begin(), strdata.end());
      erriter = err.begin() + size;
    } else if (pipe == cmsysProcess_Pipe_None) {
      // Both stdout and stderr pipes have broken.  Return leftover data.
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = out.size();
        out.insert(out.end(), strdata.begin(), strdata.end());
        outiter = out.begin() + size;
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = err.size();
        err.insert(err.end(), strdata.begin(), strdata.end());
        erriter = err.begin() + size;
      }
      if (!out.empty()) {
        line.append(&out[0], outiter - out.begin());
        out.erase(out.begin(), out.end());
        return cmsysProcess_Pipe_STDOUT;
      }
      if (!err.empty()) {
        line.append(&err[0], erriter - err.begin());
        err.erase(err.begin(), err.end());
        return cmsysProcess_Pipe_STDERR;
      }
      return cmsysProcess_Pipe_None;
    }
  }
}